

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O1

PlatformSpecificFile PlatformSpecificFOpenImplementation(char *filename,char *flag)

{
  FILE *pFVar1;
  
  pFVar1 = fopen(filename,flag);
  return pFVar1;
}

Assistant:

static PlatformSpecificFile PlatformSpecificFOpenImplementation(const char* filename, const char* flag)
{
#ifdef STDC_WANT_SECURE_LIB
  FILE* file;
   fopen_s(&file, filename, flag);
   return file;
#else
   return fopen(filename, flag);
#endif
}